

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall
ThreadContext::GetOrAddPropertyId
          (ThreadContext *this,CharacterBuffer<char16_t> *propertyName,PropertyRecord **propRecord)

{
  char16_t *pcVar1;
  PropertyRecord *pPVar2;
  CharacterBuffer<char16_t> local_40;
  
  EnterPinnedScope(propRecord);
  pcVar1 = (propertyName->string).ptr;
  Memory::Recycler::WBSetBit((char *)&local_40);
  local_40.string.ptr = pcVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
  local_40.len = propertyName->len;
  pPVar2 = GetOrAddPropertyRecord(this,&local_40);
  *propRecord = pPVar2;
  LeavePinnedScope();
  return;
}

Assistant:

void ThreadContext::GetOrAddPropertyId(_In_ JsUtil::CharacterBuffer<WCHAR> const& propertyName, _Out_ Js::PropertyRecord const ** propRecord)
{
    EnterPinnedScope((volatile void **)propRecord);
    *propRecord = GetOrAddPropertyRecord(propertyName);
    LeavePinnedScope();
}